

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_copy_key(psa_key_handle_t source_handle,psa_key_attributes_t *specified_attributes,
            psa_key_handle_t *target_handle)

{
  psa_se_drv_table_entry_t *local_70;
  psa_se_drv_table_entry_t *driver;
  psa_key_attributes_t actual_attributes;
  psa_key_slot_t *target_slot;
  psa_key_slot_t *source_slot;
  psa_key_handle_t *ppStack_20;
  psa_status_t status;
  psa_key_handle_t *target_handle_local;
  psa_key_attributes_t *specified_attributes_local;
  psa_key_handle_t source_handle_local;
  
  target_slot = (psa_key_slot_t *)0x0;
  actual_attributes.domain_parameters_size = 0;
  ppStack_20 = target_handle;
  target_handle_local = (psa_key_handle_t *)specified_attributes;
  specified_attributes_local._6_2_ = source_handle;
  memcpy(&driver,specified_attributes,0x30);
  local_70 = (psa_se_drv_table_entry_t *)0x0;
  source_slot._4_4_ = psa_get_key_from_slot(specified_attributes_local._6_2_,&target_slot,2,0);
  if ((((source_slot._4_4_ == 0) &&
       (source_slot._4_4_ =
             psa_validate_optional_attributes
                       (target_slot,(psa_key_attributes_t *)target_handle_local),
       source_slot._4_4_ == 0)) &&
      (source_slot._4_4_ =
            psa_restrict_key_policy
                      ((psa_key_policy_t *)&actual_attributes.core.lifetime,
                       &(target_slot->attr).policy), source_slot._4_4_ == 0)) &&
     ((source_slot._4_4_ =
            psa_start_key_creation
                      (PSA_KEY_CREATION_COPY,(psa_key_attributes_t *)&driver,ppStack_20,
                       (psa_key_slot_t **)&actual_attributes.domain_parameters_size,&local_70),
      source_slot._4_4_ == 0 &&
      (source_slot._4_4_ =
            psa_copy_key_material
                      (target_slot,(psa_key_slot_t *)actual_attributes.domain_parameters_size),
      source_slot._4_4_ == 0)))) {
    source_slot._4_4_ =
         psa_finish_key_creation
                   ((psa_key_slot_t *)actual_attributes.domain_parameters_size,local_70);
  }
  if (source_slot._4_4_ != 0) {
    psa_fail_key_creation((psa_key_slot_t *)actual_attributes.domain_parameters_size,local_70);
    *ppStack_20 = 0;
  }
  return source_slot._4_4_;
}

Assistant:

psa_status_t psa_copy_key( psa_key_handle_t source_handle,
                           const psa_key_attributes_t *specified_attributes,
                           psa_key_handle_t *target_handle )
{
    psa_status_t status;
    psa_key_slot_t *source_slot = NULL;
    psa_key_slot_t *target_slot = NULL;
    psa_key_attributes_t actual_attributes = *specified_attributes;
    psa_se_drv_table_entry_t *driver = NULL;

    status = psa_get_transparent_key( source_handle, &source_slot,
                                      PSA_KEY_USAGE_COPY, 0 );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_validate_optional_attributes( source_slot,
                                               specified_attributes );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_restrict_key_policy( &actual_attributes.core.policy,
                                      &source_slot->attr.policy );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_start_key_creation( PSA_KEY_CREATION_COPY,
                                     &actual_attributes,
                                     target_handle, &target_slot, &driver );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        /* Copying to a secure element is not implemented yet. */
        status = PSA_ERROR_NOT_SUPPORTED;
        goto exit;
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    status = psa_copy_key_material( source_slot, target_slot );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_finish_key_creation( target_slot, driver );
exit:
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( target_slot, driver );
        *target_handle = 0;
    }
    return( status );
}